

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void read_numeral(LexState *ls,SemInfo *seminfo)

{
  size_t sVar1;
  char cVar2;
  ZIO *pZVar3;
  byte *pbVar4;
  char *pcVar5;
  uint uVar6;
  int iVar7;
  ushort **ppuVar8;
  size_t sVar9;
  
  uVar6 = ls->current;
  do {
    save(ls,uVar6);
    pZVar3 = ls->z;
    sVar1 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar1 == 0) {
      uVar6 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar6 = (uint)*pbVar4;
    }
    ls->current = uVar6;
    ppuVar8 = __ctype_b_loc();
  } while ((uVar6 == 0x2e) || (((*ppuVar8)[(int)uVar6] & 0x800) != 0));
  iVar7 = check_next(ls,"Ee");
  if (iVar7 != 0) {
    check_next(ls,"+-");
  }
  uVar6 = ls->current;
  while ((uVar6 == 0x5f || (((*ppuVar8)[(int)uVar6] & 8) != 0))) {
    save(ls,uVar6);
    pZVar3 = ls->z;
    sVar1 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar1 == 0) {
      uVar6 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar6 = (uint)*pbVar4;
    }
    ls->current = uVar6;
  }
  save(ls,0);
  cVar2 = ls->decpoint;
  pcVar5 = ls->buff->buffer;
  sVar1 = ls->buff->n;
  while (sVar9 = sVar1, sVar9 != 0) {
    sVar1 = sVar9 - 1;
    if (pcVar5[sVar9 - 1] == '.') {
      pcVar5[sVar9 - 1] = cVar2;
    }
  }
  iVar7 = luaO_str2d(ls->buff->buffer,&seminfo->r);
  if (iVar7 != 0) {
    return;
  }
  luaX_lexerror(ls,"malformed number",0x11c);
}

Assistant:

static void read_numeral(LexState*ls,SemInfo*seminfo){
do{
save_and_next(ls);
}while(isdigit(ls->current)||ls->current=='.');
if(check_next(ls,"Ee"))
check_next(ls,"+-");
while(isalnum(ls->current)||ls->current=='_')
save_and_next(ls);
save(ls,'\0');
buffreplace(ls,'.',ls->decpoint);
if(!luaO_str2d(luaZ_buffer(ls->buff),&seminfo->r))
luaX_lexerror(ls,"malformed number",TK_NUMBER);
}